

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void __thiscall LayoutType::LayoutType(LayoutType *this)

{
  allocator local_31;
  string local_30 [32];
  LayoutType *local_10;
  LayoutType *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  LayoutType(this,0,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

LayoutType() : LayoutType(0, "") {}